

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

char * QUtil::getWhoami(char *argv0)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = strrchr(argv0,0x2f);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr(argv0,0x5c);
    if (pcVar2 == (char *)0x0) goto LAB_0023eb6c;
  }
  argv0 = pcVar2 + 1;
LAB_0023eb6c:
  sVar3 = strlen(argv0);
  if (4 < sVar3) {
    iVar1 = strcmp(argv0 + (sVar3 - 4),".exe");
    if (iVar1 == 0) {
      argv0[sVar3 - 4] = '\0';
    }
  }
  return argv0;
}

Assistant:

char*
QUtil::getWhoami(char* argv0)
{
    char* whoami = nullptr;
    if (((whoami = strrchr(argv0, '/')) == nullptr) &&
        ((whoami = strrchr(argv0, '\\')) == nullptr)) {
        whoami = argv0;
    } else {
        ++whoami;
    }

    if ((strlen(whoami) > 4) && (strcmp(whoami + strlen(whoami) - 4, ".exe") == 0)) {
        whoami[strlen(whoami) - 4] = '\0';
    }

    return whoami;
}